

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageOptions::MergePartialFromCodedStream
          (MessageOptions *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  uint uVar5;
  Limit limit;
  uint8 *puVar6;
  UninterpretedOption *this_00;
  uint uVar7;
  uint8 *puVar8;
  uint32 uVar9;
  int iVar10;
  uint32 local_4c;
  uint32 local_48;
  uint32 local_44;
  RepeatedPtrFieldBase *local_40;
  ExtensionSet *local_38;
  
  local_40 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase;
  local_38 = &this->_extensions_;
LAB_001ee212:
  while( true ) {
    puVar8 = input->buffer_;
    if ((puVar8 < input->buffer_end_) && (uVar9 = (uint32)(char)*puVar8, -1 < (char)*puVar8)) {
      input->last_tag_ = uVar9;
      input->buffer_ = puVar8 + 1;
    }
    else {
      uVar9 = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = uVar9;
    }
    if (uVar9 == 0) {
      return true;
    }
    uVar7 = uVar9 >> 3;
    uVar5 = uVar9 & 7;
    if (uVar7 != 999) break;
    if (uVar5 != 2) goto LAB_001ee29e;
    while( true ) {
      iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      iVar10 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar10) {
        ppvVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_00 = (UninterpretedOption *)ppvVar3[iVar2];
      }
      else {
        if (iVar10 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve(local_40,iVar10 + 1);
          iVar10 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_ = iVar10 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
        ppvVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = this_00;
      }
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (uVar1 = *puVar8, -1 < (char)uVar1)) {
        input->buffer_ = puVar8 + 1;
        local_4c = (int)(char)uVar1;
      }
      else {
        bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
        if (!bVar4) {
          return false;
        }
      }
      iVar2 = input->recursion_depth_;
      input->recursion_depth_ = iVar2 + 1;
      if (input->recursion_limit_ <= iVar2) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_4c);
      bVar4 = UninterpretedOption::MergePartialFromCodedStream(this_00,input);
      if (!bVar4) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      puVar6 = input->buffer_;
      if ((((int)input->buffer_end_ - (int)puVar6 < 2) || (*puVar6 != 0xba)) || (puVar6[1] != '>'))
      break;
LAB_001ee47b:
      input->buffer_ = puVar6 + 2;
    }
    if ((puVar6 == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  }
  if (uVar7 == 2) {
    if (uVar5 == 0) {
      puVar6 = input->buffer_;
      puVar8 = input->buffer_end_;
LAB_001ee326:
      if ((puVar6 < puVar8) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
        puVar6 = puVar6 + 1;
        input->buffer_ = puVar6;
        uVar9 = (int)(char)uVar1;
      }
      else {
        bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_48);
        if (!bVar4) {
          return false;
        }
        puVar6 = input->buffer_;
        puVar8 = input->buffer_end_;
        uVar9 = local_48;
      }
      this->no_standard_descriptor_accessor_ = uVar9 != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      if (((1 < (int)puVar8 - (int)puVar6) && (*puVar6 == 0xba)) && (puVar6[1] == '>'))
      goto LAB_001ee47b;
      goto LAB_001ee212;
    }
  }
  else if ((uVar7 == 1) && (uVar5 == 0)) {
    puVar6 = input->buffer_;
    puVar8 = input->buffer_end_;
    if ((puVar6 < puVar8) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
      puVar6 = puVar6 + 1;
      input->buffer_ = puVar6;
      uVar9 = (int)(char)uVar1;
    }
    else {
      bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
      if (!bVar4) {
        return false;
      }
      puVar6 = input->buffer_;
      puVar8 = input->buffer_end_;
      uVar9 = local_44;
    }
    this->message_set_wire_format_ = uVar9 != 0;
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
    if ((puVar6 < puVar8) && (*puVar6 == '\x10')) {
      puVar6 = puVar6 + 1;
      input->buffer_ = puVar6;
      goto LAB_001ee326;
    }
    goto LAB_001ee212;
  }
LAB_001ee29e:
  if (uVar5 == 4) {
    return true;
  }
  if (uVar9 < 8000) {
    bVar4 = internal::WireFormat::SkipField(input,uVar9,&this->_unknown_fields_);
  }
  else {
    bVar4 = internal::ExtensionSet::ParseField
                      (local_38,uVar9,input,default_instance_,&this->_unknown_fields_);
  }
  if (bVar4 == false) {
    return false;
  }
  goto LAB_001ee212;
}

Assistant:

bool MessageOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool message_set_wire_format = 1 [default = false];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &message_set_wire_format_)));
          set_has_message_set_wire_format();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_no_standard_descriptor_accessor;
        break;
      }

      // optional bool no_standard_descriptor_accessor = 2 [default = false];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_no_standard_descriptor_accessor:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &no_standard_descriptor_accessor_)));
          set_has_no_standard_descriptor_accessor();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}